

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_and_also(t_parser *this,bool a_assignable)

{
  t_script *ptVar1;
  undefined8 uVar2;
  pointer *__ptr;
  undefined7 in_register_00000031;
  long lVar3;
  t_at at;
  undefined1 local_58 [9];
  undefined7 uStack_4f;
  _Alloc_hider local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar3 = CONCAT71(in_register_00000031,a_assignable);
  f_or(this,a_assignable);
  while ((*(char *)(lVar3 + 0x68) == '\0' && (*(int *)(lVar3 + 0x88) == 0x23))) {
    local_38 = *(undefined8 *)(lVar3 + 0x60);
    local_48._M_p = *(pointer *)(lVar3 + 0x50);
    uStack_40 = *(undefined8 *)(lVar3 + 0x58);
    t_lexer::f_next((t_lexer *)(lVar3 + 8));
    local_58[8] = 1;
    std::
    make_unique<xemmai::ast::t_if,xemmai::t_at&,std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,bool>
              ((t_at *)local_58,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               &local_48,(bool *)this);
    uVar2 = local_58._0_8_;
    f_or((t_parser *)(local_58 + 8),a_assignable);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
    ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
              ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                *)&(((deque<xemmai::t_slot,_std::allocator<xemmai::t_slot>_> *)(uVar2 + 0x28))->
                   super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>)._M_impl.
                   super__Deque_impl_data._M_map_size,
               (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               (local_58 + 8));
    if ((long *)CONCAT71(uStack_4f,local_58[8]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_4f,local_58[8]) + 8))();
    }
    uVar2 = local_58._0_8_;
    local_58._0_8_ = (t_script *)0x0;
    ptVar1 = this->v_module;
    this->v_module = (t_script *)uVar2;
    if (ptVar1 != (t_script *)0x0) {
      (*(ptVar1->super_t_body)._vptr_t_body[1])();
      if ((t_script *)local_58._0_8_ != (t_script *)0x0) {
        (*((t_body *)local_58._0_8_)->_vptr_t_body[1])();
      }
    }
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_and_also(bool a_assignable)
{
	auto node = f_or(a_assignable);
	while (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__AND_ALSO) {
		t_at at = v_lexer.f_at();
		v_lexer.f_next();
		auto branch = std::make_unique<ast::t_if>(at, std::move(node), true);
		branch->v_true.push_back(f_or(false));
		node = std::move(branch);
	}
	return node;
}